

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O2

void __thiscall UtestShellPointerArray::reverse(UtestShellPointerArray *this)

{
  long *plVar1;
  UtestShell **ppUVar2;
  UtestShell *pUVar3;
  undefined8 uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  
  uVar5 = this->count_;
  if (uVar5 != 0) {
    uVar6 = uVar5 >> 1;
    for (uVar7 = 0; uVar5 = uVar5 - 1, uVar6 != uVar7; uVar7 = uVar7 + 1) {
      ppUVar2 = this->arrayOfTests_;
      pUVar3 = ppUVar2[uVar7];
      ppUVar2[uVar7] = ppUVar2[uVar5];
      this->arrayOfTests_[uVar5] = pUVar3;
    }
    lVar8 = -8;
    uVar4 = 0;
    for (uVar5 = 0; uVar5 < this->count_; uVar5 = uVar5 + 1) {
      plVar1 = *(long **)((long)this->arrayOfTests_ + lVar8 + this->count_ * 8);
      uVar4 = (**(code **)(*plVar1 + 0x10))(plVar1,uVar4);
      lVar8 = lVar8 + -8;
    }
    return;
  }
  return;
}

Assistant:

void UtestShellPointerArray::reverse()
{
    if (count_ == 0) return;

    size_t halfCount = count_ / 2;
    for (size_t i = 0; i < halfCount; i++)
    {
        size_t j = count_ - i - 1;
        swap(i, j);
   }
   relinkTestsInOrder();
}